

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

__pid_t __thiscall kj::EventLoop::wait(EventLoop *this,void *__stat_loc)

{
  uint uVar1;
  EventPort *pEVar2;
  Own<kj::Executor,_std::nullptr_t> *this_00;
  Executor *pEVar3;
  int in_ECX;
  nfds_t in_RDX;
  nfds_t __nfds;
  Fault local_48;
  Fault f;
  Own<kj::Executor,_std::nullptr_t> *e_1;
  Own<kj::Executor,_std::nullptr_t> *_e1894;
  Own<kj::Executor,_std::nullptr_t> *e;
  Own<kj::Executor,_std::nullptr_t> *_e1890;
  EventPort *p;
  EventPort *_p1887;
  EventLoop *this_local;
  
  if (this->wouldSleepHead == (Event *)0x0) {
    pEVar2 = kj::_::readMaybe<kj::EventPort>(&this->port);
    if (pEVar2 == (EventPort *)0x0) {
      f.exception = (Exception *)kj::_::readMaybe<kj::Executor,decltype(nullptr)>(&this->executor);
      if (f.exception == (Exception *)0x0) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[53]>
                  (&local_48,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
                   ,0x769,FAILED,(char *)0x0,
                   "\"Nothing to wait for; this thread would hang forever.\"",
                   (char (*) [53])"Nothing to wait for; this thread would hang forever.");
        kj::_::Debug::Fault::fatal(&local_48);
      }
      pEVar3 = Own<kj::Executor,_std::nullptr_t>::operator->
                         ((Own<kj::Executor,_std::nullptr_t> *)f.exception);
      uVar1 = Executor::wait(pEVar3,__stat_loc);
    }
    else {
      uVar1 = (**pEVar2->_vptr_EventPort)();
      if ((uVar1 & 1) != 0) {
        this_00 = kj::_::readMaybe<kj::Executor,decltype(nullptr)>(&this->executor);
        if (this_00 != (Own<kj::Executor,_std::nullptr_t> *)0x0) {
          pEVar3 = Own<kj::Executor,_std::nullptr_t>::operator->(this_00);
          uVar1 = Executor::poll(pEVar3,(pollfd *)__stat_loc,__nfds,in_ECX);
          this_00 = (Own<kj::Executor,_std::nullptr_t> *)(ulong)uVar1;
        }
        uVar1 = (uint)this_00;
      }
    }
  }
  else {
    uVar1 = poll(this,(pollfd *)__stat_loc,in_RDX,in_ECX);
  }
  return uVar1;
}

Assistant:

void EventLoop::wait() {
  if (wouldSleepHead != nullptr) {
    // Oh, someone wants to know when we are going to sleep. Use poll() instead so that we don't
    // actually sleep. poll() will queue the would-sleep waiter if needed.
    poll();
    return;
  }

  KJ_IF_SOME(p, port) {
    if (p.wait()) {
      // Another thread called wake(). Check for cross-thread events.
      KJ_IF_SOME(e, executor) {
        e->poll();
      }
    }
  } else KJ_IF_SOME(e, executor) {
    e->wait();
  } else {
    KJ_FAIL_REQUIRE("Nothing to wait for; this thread would hang forever.");
  }
}